

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_transaction.cpp
# Opt level: O0

uint32_t cfd::core::TxIn::EstimateTxInVsize
                   (AddressType addr_type,Script *redeem_script,Script *scriptsig_template)

{
  uint32_t uVar1;
  Script local_60;
  uint32_t local_28;
  uint32_t local_24;
  uint32_t no_witness_size;
  uint32_t witness_size;
  Script *scriptsig_template_local;
  Script *redeem_script_local;
  AddressType addr_type_local;
  
  local_24 = 0;
  local_28 = 0;
  _no_witness_size = scriptsig_template;
  scriptsig_template_local = redeem_script;
  redeem_script_local._4_4_ = addr_type;
  Script::Script(&local_60,redeem_script);
  EstimateTxInSize(addr_type,&local_60,&local_24,&local_28,_no_witness_size);
  Script::~Script(&local_60);
  uVar1 = AbstractTransaction::GetVsizeFromSize(local_28,local_24);
  return uVar1;
}

Assistant:

uint32_t TxIn::EstimateTxInVsize(
    AddressType addr_type, Script redeem_script,
    const Script *scriptsig_template) {
  uint32_t witness_size = 0;
  uint32_t no_witness_size = 0;
  TxIn::EstimateTxInSize(
      addr_type, redeem_script, &witness_size, &no_witness_size,
      scriptsig_template);
  return AbstractTransaction::GetVsizeFromSize(no_witness_size, witness_size);
}